

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::GetDocumentation
          (cmExtraSublimeTextGenerator *this,cmDocumentationEntry *entry,string *param_2)

{
  string local_30 [32];
  
  (*(this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator[2])
            (local_30,this);
  std::__cxx11::string::operator=((string *)entry,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::assign((char *)&entry->Brief);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator
::GetDocumentation(cmDocumentationEntry& entry, const std::string&) const
{
  entry.Name = this->GetName();
  entry.Brief = "Generates Sublime Text 2 project files.";
}